

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::SharedDtor(CodeGeneratorRequest *this)

{
  Version *this_00;
  Arena *pAVar1;
  LogMessage *other;
  string *default_value;
  CodeGeneratorRequest *pCVar2;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  CodeGeneratorRequest *local_10;
  CodeGeneratorRequest *this_local;
  
  local_10 = this;
  pAVar1 = MessageLite::GetArenaForAllocation((MessageLite *)this);
  local_49 = 0;
  if (pAVar1 != (Arena *)0x0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x261);
    local_49 = 1;
    other = internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_48);
  }
  default_value = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(&this->parameter_,default_value);
  pCVar2 = internal_default_instance();
  if ((this != pCVar2) && (this_00 = this->compiler_version_, this_00 != (Version *)0x0)) {
    Version::~Version(this_00);
    operator_delete(this_00);
  }
  return;
}

Assistant:

inline void CodeGeneratorRequest::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  parameter_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) delete compiler_version_;
}